

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O2

static_record_data * get_static_cache(staticCache *Cache,char *label)

{
  hashnode *phVar1;
  static_record_data *psVar2;
  _Bool is_find;
  _Bool local_9;
  
  if (Cache->is_init == true) {
    local_9 = false;
    phVar1 = get_hashnode(&Cache->table,label,&local_9);
    if ((phVar1 != (hashnode *)0x0 & local_9) == 1) {
      psVar2 = (static_record_data *)phVar1->record;
    }
    else {
      psVar2 = (static_record_data *)0x0;
    }
    return psVar2;
  }
  return (static_record_data *)0x0;
}

Assistant:

struct static_record_data* get_static_cache(struct staticCache* Cache,const char* label){
  if(Cache->is_init==true){
    bool is_find=false;
    hashnode * node = get_hashnode(&Cache->table,(void*)label,&is_find);
    if(!is_find || node==NULL)return NULL;
    return node->record;
  }
  return NULL;
}